

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O2

vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_> *
__thiscall
spvtools::opt::SENode::CollectValueUnknownNodes
          (vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
           *__return_storage_ptr__,SENode *this)

{
  pointer ppSVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppSVar3;
  SEValueUnknown *value_unknown_node;
  _Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*this->_vptr_SENode[0xe])(this);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
  if (local_38._M_impl.super__Vector_impl_data._M_start != (SEValueUnknown **)0x0) {
    std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
    push_back(__return_storage_ptr__,(value_type *)&local_38);
  }
  ppSVar1 = (this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar3 = (this->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar1;
      ppSVar3 = ppSVar3 + 1) {
    CollectValueUnknownNodes
              ((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                *)&local_38,*ppSVar3);
    std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>::
    insert<__gnu_cxx::__normal_iterator<spvtools::opt::SEValueUnknown**,std::vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>>,void>
              ((vector<spvtools::opt::SEValueUnknown*,std::allocator<spvtools::opt::SEValueUnknown*>>
                *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<spvtools::opt::SEValueUnknown_**,_std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>_>
                )local_38._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<spvtools::opt::SEValueUnknown_**,_std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>_>
                )local_38._M_impl.super__Vector_impl_data._M_finish);
    std::
    _Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
    ::~_Vector_base(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SEValueUnknown*> CollectValueUnknownNodes() {
    std::vector<SEValueUnknown*> value_unknown_nodes{};

    if (auto value_unknown_node = AsSEValueUnknown()) {
      value_unknown_nodes.push_back(value_unknown_node);
    }

    for (auto child : GetChildren()) {
      auto child_value_unknown_nodes = child->CollectValueUnknownNodes();
      value_unknown_nodes.insert(value_unknown_nodes.end(),
                                 child_value_unknown_nodes.begin(),
                                 child_value_unknown_nodes.end());
    }

    return value_unknown_nodes;
  }